

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

void aom_noise_model_free(aom_noise_model_t *model)

{
  void *in_RDI;
  int c;
  uint in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI != (void *)0x0) {
    aom_free((void *)(ulong)in_stack_fffffffffffffff0);
    for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
      equation_system_free((aom_equation_system_t *)0xa415bf);
      equation_system_free((aom_equation_system_t *)0xa415d9);
      equation_system_free((aom_equation_system_t *)0xa415fa);
      equation_system_free((aom_equation_system_t *)0xa41618);
    }
    memset(in_RDI,0,0x2c0);
  }
  return;
}

Assistant:

void aom_noise_model_free(aom_noise_model_t *model) {
  int c = 0;
  if (!model) return;

  aom_free(model->coords);
  for (c = 0; c < 3; ++c) {
    equation_system_free(&model->latest_state[c].eqns);
    equation_system_free(&model->combined_state[c].eqns);

    equation_system_free(&model->latest_state[c].strength_solver.eqns);
    equation_system_free(&model->combined_state[c].strength_solver.eqns);
  }
  memset(model, 0, sizeof(*model));
}